

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

int Internal_Convertfwrite
              (CPalThread *pthrCurrent,void *buffer,size_t size,size_t count,FILE *stream,
              BOOL convert)

{
  FILE *pFVar1;
  DWORD DVar2;
  CorUnix *this;
  size_t sVar3;
  undefined4 in_register_0000008c;
  INT *pnErrorCode;
  LPSTR newBuff;
  int nsize;
  int iError;
  int ret;
  BOOL convert_local;
  FILE *stream_local;
  size_t count_local;
  size_t size_local;
  void *buffer_local;
  CPalThread *pthrCurrent_local;
  
  newBuff._4_4_ = 0;
  iError = convert;
  _ret = stream;
  stream_local = (FILE *)count;
  count_local = size;
  size_local = (size_t)buffer;
  buffer_local = pthrCurrent;
  if (convert == 0) {
    sVar3 = CorUnix::InternalFwrite
                      ((CorUnix *)buffer,(void *)size,count,(size_t)stream,
                       (FILE *)((long)&newBuff + 4),(INT *)CONCAT44(in_register_0000008c,convert));
    nsize = (int)sVar3;
    if (newBuff._4_4_ != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return -1;
      }
      abort();
    }
  }
  else {
    newBuff._0_4_ =
         WideCharToMultiByte(0,0,(LPCWSTR)buffer,(int)count,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if ((uint)newBuff == 0) {
      fprintf(_stderr,"] %s %s:%d","Internal_Convertfwrite",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,0x46);
      pFVar1 = _stderr;
      DVar2 = GetLastError();
      fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
      return -1;
    }
    this = (CorUnix *)CorUnix::InternalMalloc((long)(int)(uint)newBuff);
    if (this == (CorUnix *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        CorUnix::CPalThread::SetLastError(8);
        return -1;
      }
      abort();
    }
    pnErrorCode = (INT *)(ulong)(uint)newBuff;
    newBuff._0_4_ =
         WideCharToMultiByte(0,0,(LPCWSTR)size_local,(int)stream_local,(LPSTR)this,(uint)newBuff,
                             (LPCSTR)0x0,(LPBOOL)0x0);
    if ((uint)newBuff == 0) {
      fprintf(_stderr,"] %s %s:%d","Internal_Convertfwrite",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
              ,0x53);
      pFVar1 = _stderr;
      DVar2 = GetLastError();
      fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
      CorUnix::InternalFree(this);
      return -1;
    }
    sVar3 = CorUnix::InternalFwrite
                      (this,&DAT_00000001,(long)(int)(uint)newBuff,(size_t)_ret,
                       (FILE *)((long)&newBuff + 4),pnErrorCode);
    nsize = (int)sVar3;
    if (newBuff._4_4_ != 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        CorUnix::InternalFree(this);
        return -1;
      }
      abort();
    }
    CorUnix::InternalFree(this);
  }
  return nsize;
}

Assistant:

static int Internal_Convertfwrite(CPalThread *pthrCurrent, const void *buffer, size_t size, size_t count, FILE *stream, BOOL convert)
{
    int ret;
    int iError = 0;

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr (stream);
#endif

    if(convert)
    {
        int nsize;
        LPSTR newBuff = 0;
        nsize = WideCharToMultiByte(CP_ACP, 0,(LPCWSTR)buffer, count, 0, 0, 0, 0);
        if (!nsize)
        {
            ASSERT("WideCharToMultiByte failed.  Error is %d\n", GetLastError());
            return -1;
        }
        newBuff = (LPSTR) InternalMalloc(nsize);
        if (!newBuff)
        {
            ERROR("InternalMalloc failed\n");
            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            return -1;
        }
        nsize = WideCharToMultiByte(CP_ACP, 0, (LPCWSTR)buffer, count, newBuff, nsize, 0, 0);
        if (!nsize)
        {
            ASSERT("WideCharToMultiByte failed.  Error is %d\n", GetLastError());
            InternalFree(newBuff);
            return -1;
        }
        ret = InternalFwrite(newBuff, 1, nsize, stream, &iError);
        if (iError != 0)
        {
            ERROR("InternalFwrite did not write the whole buffer. Error is %d\n", iError);
            InternalFree(newBuff);
            return -1;
        }
        InternalFree(newBuff);
   }
   else
   {
        ret = InternalFwrite(buffer, size, count, stream, &iError);
        if (iError != 0)
        {
            ERROR("InternalFwrite did not write the whole buffer. Error is %d\n", iError);
            return -1;
        }
   }
   return ret;

}